

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# History.cpp
# Opt level: O2

void __thiscall History::History(History *this)

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"",&local_31);
  this->numberOfAssignments = 0;
  this->numberOfWorkingWeekends = 0;
  this->numberOfConsecutiveAssignments = 0;
  this->numberOfConsecutiveWorkingDays = 0;
  this->numberOfConsecutiveDaysOff = 0;
  std::__cxx11::string::string((string *)&this->lastAssignedShiftType,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

History::History() : History(0,0,0,0,0,"") {}